

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBase32.cxx
# Opt level: O2

string * __thiscall
cmBase32Encoder::encodeString_abi_cxx11_
          (string *__return_storage_ptr__,cmBase32Encoder *this,uchar *input,size_t len,bool padding
          )

{
  uchar *puVar1;
  size_t ii;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  uchar extended [5];
  char buffer [8];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = input + len;
  while (input + 5 <= puVar1) {
    Base32Encode5(input,buffer);
    len = len - 5;
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)buffer);
    input = input + 5;
  }
  if (len != 0) {
    lVar2 = 0;
    uVar4 = len;
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, uVar3 = len, bVar5) {
      extended[lVar2] = input[lVar2];
      lVar2 = lVar2 + 1;
    }
    for (; uVar3 != 5; uVar3 = uVar3 + 1) {
      extended[uVar3] = '\0';
    }
    Base32Encode5(extended,buffer);
    if (len < 5) {
      lVar2 = *(long *)("ABCDEFGHIJKLMNOPQRSTUVWXYZ234567" + len * 8 + 0x20);
    }
    else {
      lVar2 = 0;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)buffer);
    if (padding) {
      while (bVar5 = lVar2 != 0, lVar2 = lVar2 + -1, bVar5) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmBase32Encoder::encodeString(const unsigned char* input,
                                          size_t len, bool padding)
{
  std::string res;

  static const size_t blockSize = 5;
  static const size_t bufferSize = 8;
  char buffer[bufferSize];

  const unsigned char* end = input + len;
  while ((input + blockSize) <= end) {
    Base32Encode5(input, buffer);
    res.append(buffer, bufferSize);
    input += blockSize;
  }

  size_t remain = static_cast<size_t>(end - input);
  if (remain != 0) {
    // Temporary source buffer filled up with 0s
    unsigned char extended[blockSize];
    for (size_t ii = 0; ii != remain; ++ii) {
      extended[ii] = input[ii];
    }
    for (size_t ii = remain; ii != blockSize; ++ii) {
      extended[ii] = 0;
    }

    Base32Encode5(extended, buffer);
    size_t numPad(0);
    switch (remain) {
      case 1:
        numPad = 6;
        break;
      case 2:
        numPad = 4;
        break;
      case 3:
        numPad = 3;
        break;
      case 4:
        numPad = 1;
        break;
      default:
        break;
    }
    res.append(buffer, bufferSize - numPad);
    if (padding) {
      for (size_t ii = 0; ii != numPad; ++ii) {
        res.push_back(paddingChar);
      }
    }
  }

  return res;
}